

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O2

void __thiscall
HawkTracer::parser::KlassRegister::_add_klass
          (KlassRegister *this,
          unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
          *klass)

{
  iterator iVar1;
  uint32_t local_30 [2];
  _Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false> local_28;
  
  std::mutex::lock(&this->_register_mtx);
  local_30[0] = ((klass->_M_t).
                 super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
                 .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl)->_id;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_register)._M_h,local_30);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_28._M_head_impl =
         (klass->_M_t).
         super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
         ._M_t.
         super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
         .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl;
    local_30[0] = (local_28._M_head_impl)->_id;
    (klass->_M_t).
    super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
    ._M_t.
    super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
    .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl = (EventKlass *)0x0
    ;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<unsigned_int,std::unique_ptr<HawkTracer::parser::EventKlass,std::default_delete<HawkTracer::parser::EventKlass>>>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->_register,local_30);
    std::
    unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
    ::~unique_ptr((unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                   *)&local_28);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void KlassRegister::_add_klass(std::unique_ptr<EventKlass> klass)
{
    lock_guard l(_register_mtx);
    if (_register.find(klass->get_id()) == _register.end())
    {
        _register.insert(std::make_pair(klass->get_id(), std::move(klass)));
    }
}